

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool testing::internal::
     MatchPrintAndExplain<phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const,phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const&>
               (parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>
                *value,Matcher<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                       *matcher,MatchResultListener *listener)

{
  anon_union_8_1_a8a14541_for_iterator_1 ptr;
  bool bVar1;
  ostream *poVar2;
  type_info *type;
  long lVar3;
  StringMatchResultListener inner_listener;
  char local_218;
  undefined7 uStack_217;
  long local_210;
  long local_208 [2];
  const_iterator local_1f8;
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (listener->stream_ == (ostream *)0x0) {
    local_1c8.stream_ = (ostream *)0x0;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00271f70;
    bVar1 = MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
            ::MatchAndExplain(&matcher->
                               super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                              ,value,&local_1c8);
  }
  else {
    local_1c8.stream_ = local_1a8;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00271fe8;
    std::__cxx11::stringstream::stringstream(local_1b8);
    bVar1 = MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
            ::MatchAndExplain(&matcher->
                               super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                              ,value,&local_1c8);
    poVar2 = listener->stream_;
    local_1f8.iter_.inner_._0_1_ = 0x7b;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1f8,1);
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ::begin(&local_1f8,
            &value->
             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           );
    if (CONCAT71(local_1f8.iter_.inner_._1_7_,local_1f8.iter_.inner_._0_1_) != 0) {
      lVar3 = 0;
      do {
        ptr = local_1f8.iter_.it_.field_1;
        if (lVar3 != 0) {
          local_218 = ',';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_218,1);
          if (lVar3 == 0x20) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ...",4);
            goto LAB_001220e0;
          }
        }
        local_218 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_218,1);
        PrintSmartPointer<int,std::unique_ptr<int,std::default_delete<int>>,void>
                  (ptr.slot_,poVar2,0);
        lVar3 = lVar3 + 1;
        phmap::priv::
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        ::const_iterator::operator++(&local_1f8);
      } while (CONCAT71(local_1f8.iter_.inner_._1_7_,local_1f8.iter_.inner_._0_1_) != 0);
      if (lVar3 != 0) {
LAB_001220e0:
        local_1f8.iter_.inner_._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1f8,1);
      }
    }
    local_1f8.iter_.inner_._0_1_ = 0x7d;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1f8,1);
    GetTypeName_abi_cxx11_
              ((string *)&local_1f8,
               (internal *)
               &phmap::
                parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>
                ::typeinfo,type);
    if ((local_1f8.iter_.inner_end_ < (Inner *)0x15) ||
       (lVar3 = std::__cxx11::string::find_first_of((char *)&local_1f8,0x20c2d7,0), lVar3 == -1)) {
      poVar2 = listener->stream_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (of type ",10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT71(local_1f8.iter_.inner_._1_7_,
                                                  local_1f8.iter_.inner_._0_1_),
                          (long)local_1f8.iter_.inner_end_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    }
    std::__cxx11::stringbuf::str();
    poVar2 = listener->stream_;
    if ((poVar2 != (ostream *)0x0) && (local_210 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,(char *)CONCAT71(uStack_217,local_218),local_210);
    }
    if ((long *)CONCAT71(uStack_217,local_218) != local_208) {
      operator_delete((long *)CONCAT71(uStack_217,local_218),local_208[0] + 1);
    }
    if ((EmbeddedIterator *)CONCAT71(local_1f8.iter_.inner_._1_7_,local_1f8.iter_.inner_._0_1_) !=
        &local_1f8.iter_.it_) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8.iter_.inner_._1_7_,local_1f8.iter_.inner_._0_1_),
                      (ulong)((long)local_1f8.iter_.it_.ctrl_ + 1));
    }
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00271fe8;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return bVar1;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}